

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O2

void gimage::extractContour(Polygon *p,ImageU8 *mask,ImageU8 *image,long sx,long sy,int dir)

{
  uchar uVar1;
  pointer pSVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long x;
  long lVar8;
  long y;
  
  pSVar2 = (p->vertex).
           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((p->vertex).
      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pSVar2) {
    (p->vertex).
    super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar2;
  }
  Polygon::add(p,sx,sy);
  x = sx;
  y = sy;
  do {
    uVar1 = (*image->img)[y][x];
    (*mask->img)[y][x] = 0xff;
    bVar4 = true;
    uVar6 = (ulong)(uint)dir;
    while( true ) {
      uVar3 = (long)((int)uVar6 + 1) % 8;
      uVar6 = uVar3 & 0xffffffff;
      if ((!bVar4) || (uVar5 = (uint)uVar3, uVar5 == dir)) break;
      lVar8 = *(long *)((anonymous_namespace)::
                        nextContourPixel(long&,long&,int&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>const&,long,long)
                        ::dx + (long)(int)uVar5 * 8) + x;
      lVar7 = *(long *)((anonymous_namespace)::
                        nextContourPixel(long&,long&,int&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>const&,long,long)
                        ::dy + (long)(int)uVar5 * 8) + y;
      if (lVar7 == sy && lVar8 == sx) {
        return;
      }
      bVar4 = true;
      if ((((-1 < lVar8) && (-1 < lVar7)) && (lVar8 < image->width)) &&
         (((lVar7 < image->height && ((*image->img)[lVar7][lVar8] == uVar1)) &&
          ((*mask->img)[lVar7][lVar8] == '\0')))) {
        dir = (int)((char)((char)uVar3 + '\x04') % '\b');
        bVar4 = false;
        x = lVar8;
        y = lVar7;
      }
    }
    if (bVar4) {
      return;
    }
    Polygon::add(p,x,y);
  } while( true );
}

Assistant:

void extractContour(Polygon &p, ImageU8 &mask, const ImageU8 &image, long sx, long sy, int dir)
{
  long x=sx;
  long y=sy;

  p.clear();
  p.add(x, y);

  while (nextContourPixel(x, y, dir, mask, image, sx, sy))
  {
    p.add(x, y);
  }
}